

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_insi(DisasContext_conflict13 *s,DisasOps *o)

{
  int size;
  int shift;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_gen_deposit_i64_s390x
            (s->uc->tcg_ctx,o->out,o->in1,o->in2,(uint)s->insn->data & 0xff,
             (uint)(s->insn->data >> 8));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_insi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int shift = s->insn->data & 0xff;
    int size = s->insn->data >> 8;
    tcg_gen_deposit_i64(tcg_ctx, o->out, o->in1, o->in2, shift, size);
    return DISAS_NEXT;
}